

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 1_custom_app_return_codes.cpp
# Opt level: O3

int main(void)

{
  logic_error *this;
  
  this = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this,"std::exception!");
  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

int main() try // Function try block
{
   throw_std_exception();
	return EXIT_SUCCESS;
}
catch (...)
{
   using namespace mittens;
   return all_catcher(-1, std_exception_handler(-2, bad_alloc_handler(-3))).handleException(); 
}